

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

QByteArray * __thiscall
QAuthenticatorPrivate::calculateResponse
          (QAuthenticatorPrivate *this,QByteArrayView requestMethod,QByteArrayView path,
          QStringView host)

{
  QStringView host_00;
  QByteArrayView challenge;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  QAuthenticatorPrivate *in_RSI;
  QAuthenticatorPrivate *in_RDI;
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *in_R8;
  QStringBuilder<QString_&,_QLatin1Char> *in_R9;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QLatin1Char> QVar2;
  QStringBuilder<QByteArrayView_&,_char> QVar3;
  QByteArray phase3Token;
  QByteArray phase1Token;
  undefined1 in_stack_000001f0 [16];
  QByteArrayView in_stack_00000200;
  QByteArrayView in_stack_00000280;
  QByteArrayView methodString;
  QByteArray response;
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *in_stack_fffffffffffffca8;
  QStringBuilder<QString_&,_QLatin1Char> *in_stack_fffffffffffffcb0;
  QByteArrayView *in_stack_fffffffffffffcb8;
  QByteArrayView *in_stack_fffffffffffffcc0;
  QByteArray *pQVar4;
  QAuthenticatorPrivate *ctx;
  undefined1 in_stack_fffffffffffffd10;
  undefined7 in_stack_fffffffffffffd11;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined1 local_2e0 [32];
  QByteArray local_2c0;
  QAuthenticatorPrivate *in_stack_fffffffffffffd60;
  storage_type *in_stack_fffffffffffffd68;
  undefined1 local_260 [64];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  qsizetype local_208;
  storage_type *local_200;
  QByteArray local_1f0 [2];
  undefined1 local_1c0 [56];
  undefined1 local_188 [24];
  qsizetype local_170;
  storage_type *local_168;
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *local_160;
  QStringBuilder<QString_&,_QLatin1Char> *local_158;
  undefined8 local_150;
  undefined8 local_148;
  qsizetype local_118;
  storage_type *local_110;
  QString *local_100;
  char local_f8;
  char local_e9;
  undefined1 local_d0 [24];
  qsizetype local_b8;
  storage_type *psStack_b0;
  QByteArrayView local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  QStringBuilder<QStringBuilder<QByteArrayView_&,_char>,_QByteArray_&> *local_78;
  QStringBuilder<QString_&,_QLatin1Char> *local_70;
  undefined8 local_68;
  undefined8 local_60;
  QByteArrayView *local_58;
  char local_50;
  QString *local_30;
  char local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = 0xaaaaaaaaaaaaaaaa;
  local_98 = 0xaaaaaaaaaaaaaaaa;
  uStack_90 = 0xaaaaaaaaaaaaaaaa;
  ctx = in_RDI;
  local_78 = in_R8;
  local_70 = in_R9;
  local_68 = in_RDX;
  local_60 = in_RCX;
  QByteArray::QByteArray((QByteArray *)0x206bc8);
  local_a8.m_size = -0x5555555555555556;
  local_a8.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
  QByteArrayView::QByteArrayView(&local_a8);
  switch(in_RSI->method) {
  case None:
    in_RSI->phase = Done;
    break;
  case Basic:
    QByteArrayView::QByteArrayView<6ul>
              (in_stack_fffffffffffffcc0,(char (*) [6])in_stack_fffffffffffffcb8);
    local_a8.m_size = local_b8;
    local_a8.m_data = psStack_b0;
    local_e9 = (char)Qt::Literals::StringLiterals::operator____L1
                               ((char)((ulong)in_stack_fffffffffffffca8 >> 0x30));
    QVar2 = ::operator+((QString *)in_stack_fffffffffffffcb8,
                        (QLatin1Char *)in_stack_fffffffffffffcb0);
    local_100 = QVar2.a;
    local_f8 = (char)QVar2.b.ch;
    local_30 = local_100;
    local_28 = local_f8;
    ::operator+(in_stack_fffffffffffffcb0,(QString *)in_stack_fffffffffffffca8);
    QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>::
    toLatin1((QStringBuilderBase<QStringBuilder<QStringBuilder<QString_&,_QLatin1Char>,_QString_&>,_QString>
              *)in_stack_fffffffffffffcb8);
    QFlags<QByteArray::Base64Option>::QFlags
              ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
               (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
    QByteArray::toBase64((QFlags_conflict *)local_d0);
    QByteArray::operator=
              ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
    QByteArray::~QByteArray((QByteArray *)0x206d1b);
    QByteArray::~QByteArray((QByteArray *)0x206d28);
    in_RSI->phase = Done;
    break;
  case Negotiate:
    QByteArrayView::QByteArrayView<10ul>
              (in_stack_fffffffffffffcc0,(char (*) [10])in_stack_fffffffffffffcb8);
    local_a8.m_size = local_208;
    local_a8.m_data = local_200;
    bVar1 = QByteArray::isEmpty((QByteArray *)0x20704a);
    if (bVar1) {
      local_220 = 0xaaaaaaaaaaaaaaaa;
      local_218 = 0xaaaaaaaaaaaaaaaa;
      local_210 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)0x20708d);
      host_00.m_size._1_7_ = in_stack_fffffffffffffd11;
      host_00.m_size._0_1_ = in_stack_fffffffffffffd10;
      host_00.m_data._0_4_ = in_stack_fffffffffffffd18;
      host_00.m_data._4_4_ = in_stack_fffffffffffffd1c;
      qGssapiStartup(in_RSI,host_00);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
      QByteArray::~QByteArray((QByteArray *)0x2070ed);
      bVar1 = QByteArray::isEmpty((QByteArray *)0x2070fa);
      if (bVar1) {
        in_RSI->phase = Done;
        QByteArray::QByteArray((QByteArray *)in_RDI,"",-1);
      }
      else {
        QFlags<QByteArray::Base64Option>::QFlags
                  ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                   (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        QByteArray::toBase64((QFlags_conflict *)local_260);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
        QByteArray::~QByteArray((QByteArray *)0x20714b);
        in_RSI->phase = Phase2;
      }
      QByteArray::~QByteArray((QByteArray *)0x2071a2);
      if (bVar1) goto LAB_002073d8;
    }
    else {
      QByteArray::QByteArray((QByteArray *)0x2071ef);
      bVar1 = QScopedPointer::operator_cast_to_bool
                        ((QScopedPointer<QGssApiHandles,_QScopedPointerDeleter<QGssApiHandles>_> *)
                         0x207200);
      if (bVar1) {
        in_stack_fffffffffffffcb8 = (QByteArrayView *)&in_RSI->challenge;
        QFlags<QByteArray::Base64Option>::QFlags
                  ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                   (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        QByteArray::fromBase64(&local_2c0,(QFlags_conflict *)in_stack_fffffffffffffcb8);
        QByteArrayView::QByteArrayView<QByteArray,_true>
                  (in_stack_fffffffffffffcc0,(QByteArray *)in_stack_fffffffffffffcb8);
        challenge.m_data = in_stack_fffffffffffffd68;
        challenge.m_size = (qsizetype)in_stack_fffffffffffffd60;
        qGssapiContinue((QAuthenticatorPrivate *)
                        CONCAT71(in_stack_fffffffffffffd11,in_stack_fffffffffffffd10),challenge);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
        QByteArray::~QByteArray((QByteArray *)0x207298);
        QByteArray::~QByteArray((QByteArray *)0x2072a5);
      }
      bVar1 = QByteArray::isEmpty((QByteArray *)0x2072b2);
      if (bVar1) {
        in_RSI->phase = Done;
        QByteArray::QByteArray((QByteArray *)in_RDI,"",-1);
      }
      else {
        QFlags<QByteArray::Base64Option>::QFlags
                  ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                   (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
        QByteArray::toBase64((QFlags_conflict *)local_2e0);
        QByteArray::operator=
                  ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
        QByteArray::~QByteArray((QByteArray *)0x2072f4);
        in_RSI->phase = Done;
        QByteArray::operator=(&in_RSI->challenge,"");
      }
      QByteArray::~QByteArray((QByteArray *)0x20735b);
      if (bVar1) goto LAB_002073d8;
    }
    break;
  case Ntlm:
    QByteArrayView::QByteArrayView<5ul>
              (in_stack_fffffffffffffcc0,(char (*) [5])in_stack_fffffffffffffcb8);
    local_a8.m_size = local_170;
    local_a8.m_data = local_168;
    bVar1 = QByteArray::isEmpty((QByteArray *)0x206e88);
    if (bVar1) {
      qNtlmPhase1();
      QFlags<QByteArray::Base64Option>::QFlags
                ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                 (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      QByteArray::toBase64((QFlags_conflict *)local_188);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
      QByteArray::~QByteArray((QByteArray *)0x206eeb);
      QByteArray::~QByteArray((QByteArray *)0x206ef8);
      bVar1 = QString::isEmpty((QString *)0x206f02);
      if (bVar1) {
        in_RSI->phase = Done;
      }
      else {
        in_RSI->phase = Phase2;
      }
    }
    else {
      pQVar4 = &in_RSI->challenge;
      QFlags<QByteArray::Base64Option>::QFlags
                ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                 (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      QByteArray::fromBase64(local_1f0,(QFlags_conflict *)pQVar4);
      qNtlmPhase3(ctx,(QByteArray *)in_RDI);
      QFlags<QByteArray::Base64Option>::QFlags
                ((QFlags<QByteArray::Base64Option> *)in_stack_fffffffffffffcb0,
                 (Base64Option)((ulong)in_stack_fffffffffffffca8 >> 0x20));
      QByteArray::toBase64((QFlags_conflict *)local_1c0);
      QByteArray::operator=
                ((QByteArray *)in_stack_fffffffffffffcb0,(QByteArray *)in_stack_fffffffffffffca8);
      QByteArray::~QByteArray((QByteArray *)0x206fca);
      QByteArray::~QByteArray((QByteArray *)0x206fd7);
      QByteArray::~QByteArray((QByteArray *)0x206fe4);
      in_RSI->phase = Done;
      QByteArray::operator=(&in_RSI->challenge,"");
    }
    break;
  case DigestMd5:
    QByteArrayView::QByteArrayView<7ul>
              (in_stack_fffffffffffffcc0,(char (*) [7])in_stack_fffffffffffffcb8);
    local_a8.m_size = local_118;
    local_a8.m_data = local_110;
    QByteArrayView::QByteArrayView<QByteArray,_true>
              (in_stack_fffffffffffffcc0,(QByteArray *)in_stack_fffffffffffffcb8);
    local_150 = local_68;
    local_148 = local_60;
    local_160 = local_78;
    local_158 = local_70;
    digestMd5Response(in_stack_fffffffffffffd60,in_stack_00000200,(QByteArrayView)in_stack_000001f0,
                      in_stack_00000280);
    QByteArray::operator=((QByteArray *)local_70,(QByteArray *)local_78);
    QByteArray::~QByteArray((QByteArray *)0x206e32);
    in_RSI->phase = Done;
    in_stack_fffffffffffffca8 = local_78;
    in_stack_fffffffffffffcb0 = local_70;
  }
  QVar3 = ::operator+(in_stack_fffffffffffffcb8,(char *)in_stack_fffffffffffffcb0);
  local_58 = QVar3.a;
  local_50 = QVar3.b;
  ::operator+((QStringBuilder<QByteArrayView_&,_char> *)in_stack_fffffffffffffcb0,
              (QByteArray *)in_stack_fffffffffffffca8);
  ::QStringBuilder::operator_cast_to_QByteArray(in_stack_fffffffffffffca8);
LAB_002073d8:
  QByteArray::~QByteArray((QByteArray *)0x2073e5);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)ctx;
}

Assistant:

QByteArray QAuthenticatorPrivate::calculateResponse(QByteArrayView requestMethod,
                                                    QByteArrayView path, QStringView host)
{
#if !QT_CONFIG(sspi) && !QT_CONFIG(gssapi)
    Q_UNUSED(host);
#endif
    QByteArray response;
    QByteArrayView methodString;
    switch(method) {
    case QAuthenticatorPrivate::None:
        phase = Done;
        break;
    case QAuthenticatorPrivate::Basic:
        methodString = "Basic";
        response = (user + ':'_L1 + password).toLatin1().toBase64();
        phase = Done;
        break;
    case QAuthenticatorPrivate::DigestMd5:
        methodString = "Digest";
        response = digestMd5Response(challenge, requestMethod, path);
        phase = Done;
        break;
    case QAuthenticatorPrivate::Ntlm:
        methodString = "NTLM";
        if (challenge.isEmpty()) {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase1Token;
            if (user.isEmpty()) { // Only pull from system if no user was specified in authenticator
                phase1Token = qSspiStartup(this, method, host);
            } else if (!q_SSPI_library_load()) {
                // Since we're not running qSspiStartup we have to make sure the library is loaded
                qWarning("Failed to load the SSPI libraries");
                return "";
            }
            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else
#endif
            {
                response = qNtlmPhase1().toBase64();
                if (user.isEmpty())
                    phase = Done;
                else
                    phase = Phase2;
            }
        } else {
#if QT_CONFIG(sspi) // SSPI
            QByteArray phase3Token;
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
            } else
#endif
            {
                response = qNtlmPhase3(this, QByteArray::fromBase64(challenge)).toBase64();
                phase = Done;
            }
            challenge = "";
        }

        break;
    case QAuthenticatorPrivate::Negotiate:
        methodString = "Negotiate";
        if (challenge.isEmpty()) {
            QByteArray phase1Token;
#if QT_CONFIG(sspi) // SSPI
            phase1Token = qSspiStartup(this, method, host);
#elif QT_CONFIG(gssapi) // GSSAPI
            phase1Token = qGssapiStartup(this, host);
#endif

            if (!phase1Token.isEmpty()) {
                response = phase1Token.toBase64();
                phase = Phase2;
            } else {
                phase = Done;
                return "";
            }
        } else {
            QByteArray phase3Token;
#if QT_CONFIG(sspi) // SSPI
            if (sspiWindowsHandles)
                phase3Token = qSspiContinue(this, method, host, QByteArray::fromBase64(challenge));
#elif QT_CONFIG(gssapi) // GSSAPI
            if (gssApiHandles)
                phase3Token = qGssapiContinue(this, QByteArray::fromBase64(challenge));
#endif
            if (!phase3Token.isEmpty()) {
                response = phase3Token.toBase64();
                phase = Done;
                challenge = "";
            } else {
                phase = Done;
                return "";
            }
        }

        break;
    }

    return methodString + ' ' + response;
}